

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void * stb_file(char *filename,size_t *length)

{
  FILE *__stream;
  size_t __n;
  size_t sVar1;
  size_t len2;
  size_t len;
  char *buffer;
  FILE *f;
  size_t *length_local;
  char *filename_local;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    __n = stb_filelen((FILE *)__stream);
    len = (size_t)malloc(__n + 2);
    sVar1 = fread((void *)len,1,__n,__stream);
    if (sVar1 == __n) {
      if (length != (size_t *)0x0) {
        *length = __n;
      }
      *(undefined1 *)(len + __n) = 0;
    }
    else {
      free((void *)len);
      len = 0;
    }
    fclose(__stream);
    filename_local = (char *)len;
  }
  return filename_local;
}

Assistant:

void *stb_file(char *filename, size_t *length)
{
   FILE *f = stb__fopen(filename, "rb");
   char *buffer;
   size_t len, len2;
   if (!f) return NULL;
   len = stb_filelen(f);
   buffer = (char *) malloc(len+2); // nul + extra
   len2 = fread(buffer, 1, len, f);
   if (len2 == len) {
      if (length) *length = len;
      buffer[len] = 0;
   } else {
      free(buffer);
      buffer = NULL;
   }
   fclose(f);
   return buffer;
}